

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int x2;
  int x1;
  int local_30;
  int local_2c;
  
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2c);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::operator>>((istream *)&std::cin,&local_30);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_30);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ans=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30 + local_2c);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(){
    int x1,x2,gou;
    std::cin >> x1;
    std::cout << x1 << std::endl;

    std::cin >> x2;
    std::cout << x2 << std::endl;

    gou = sum(x1,x2);

    std::cout << "ans=" << gou << std::endl;
    return 0;
}